

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultFunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultFunctionPortSyntax,slang::syntax::DefaultFunctionPortSyntax_const&>
          (BumpAllocator *this,DefaultFunctionPortSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  DefaultFunctionPortSyntax *pDVar8;
  
  pDVar8 = (DefaultFunctionPortSyntax *)allocate(this,0x28,8);
  uVar3 = *(undefined4 *)&(args->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_FunctionPortBaseSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode;
  TVar4 = (args->keyword).kind;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.kind =
       (args->super_FunctionPortBaseSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pDVar8->keyword).kind = TVar4;
  (pDVar8->keyword).field_0x2 = uVar5;
  (pDVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar8->keyword).rawLen = uVar7;
  (pDVar8->keyword).info = (args->keyword).info;
  return pDVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }